

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.cpp
# Opt level: O0

int ecdsa_signature_parse_der_lax(secp256k1_ecdsa_signature *sig,uchar *input,size_t inputlen)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  uchar *puVar4;
  uchar *in_RDX;
  secp256k1_ecdsa_signature *in_RSI;
  secp256k1_context *in_RDI;
  long in_FS_OFFSET;
  bool bVar5;
  bool bVar6;
  int overflow;
  size_t lenbyte;
  size_t pos;
  size_t slen;
  size_t spos;
  size_t rlen;
  size_t rpos;
  uchar tmpsig [64];
  ulong local_98;
  uchar *local_90;
  ulong local_88;
  uchar *local_80;
  ulong local_78;
  uchar *local_70;
  int local_4c;
  undefined1 local_48 [32];
  undefined1 auStack_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_48,0,0x40);
  secp256k1_ecdsa_signature_parse_compact(in_RDI,in_RSI,in_RDX);
  if ((in_RDX == (uchar *)0x0) || (in_RSI->data[0] != '0')) {
    local_4c = 0;
  }
  else if (in_RDX == (uchar *)0x1) {
    local_4c = 0;
  }
  else {
    local_90 = (uchar *)0x2;
    bVar1 = in_RSI->data[1];
    if ((bVar1 & 0x80) != 0) {
      if (in_RDX + -2 < (uchar *)((ulong)bVar1 - 0x80)) {
        local_4c = 0;
        goto LAB_010179c6;
      }
      local_90 = (uchar *)((ulong)bVar1 - 0x7e);
    }
    if ((local_90 == in_RDX) || (local_90[(long)in_RSI->data] != '\x02')) {
      local_4c = 0;
    }
    else {
      puVar4 = local_90 + 1;
      if (puVar4 == in_RDX) {
        local_4c = 0;
      }
      else {
        local_90 = local_90 + 2;
        bVar1 = puVar4[(long)in_RSI->data];
        local_78 = (ulong)bVar1;
        if ((bVar1 & 0x80) != 0) {
          local_98 = local_78 - 0x80;
          if ((ulong)((long)in_RDX - (long)local_90) < local_98) {
            local_4c = 0;
            goto LAB_010179c6;
          }
          while( true ) {
            bVar5 = false;
            if (local_98 != 0) {
              bVar5 = local_90[(long)in_RSI->data] == '\0';
            }
            if (!bVar5) break;
            local_90 = local_90 + 1;
            local_98 = local_98 - 1;
          }
          if (3 < local_98) {
            local_4c = 0;
            goto LAB_010179c6;
          }
          local_78 = 0;
          for (; local_98 != 0; local_98 = local_98 - 1) {
            local_78 = local_78 * 0x100 + (ulong)local_90[(long)in_RSI->data];
            local_90 = local_90 + 1;
          }
        }
        if ((ulong)((long)in_RDX - (long)local_90) < local_78) {
          local_4c = 0;
        }
        else {
          local_70 = local_90;
          puVar4 = local_90 + local_78;
          if ((puVar4 == in_RDX) || (puVar4[(long)in_RSI->data] != '\x02')) {
            local_4c = 0;
          }
          else if (puVar4 + 1 == in_RDX) {
            local_4c = 0;
          }
          else {
            local_90 = puVar4 + 2;
            bVar1 = (puVar4 + 1)[(long)in_RSI->data];
            local_88 = (ulong)bVar1;
            if ((bVar1 & 0x80) != 0) {
              local_98 = local_88 - 0x80;
              if ((ulong)((long)in_RDX - (long)local_90) < local_98) {
                local_4c = 0;
                goto LAB_010179c6;
              }
              while( true ) {
                bVar5 = false;
                if (local_98 != 0) {
                  bVar5 = local_90[(long)in_RSI->data] == '\0';
                }
                if (!bVar5) break;
                local_90 = local_90 + 1;
                local_98 = local_98 - 1;
              }
              if (3 < local_98) {
                local_4c = 0;
                goto LAB_010179c6;
              }
              local_88 = 0;
              for (; local_98 != 0; local_98 = local_98 - 1) {
                local_88 = local_88 * 0x100 + (ulong)local_90[(long)in_RSI->data];
                local_90 = local_90 + 1;
              }
            }
            if ((ulong)((long)in_RDX - (long)local_90) < local_88) {
              local_4c = 0;
            }
            else {
              local_80 = local_90;
              while( true ) {
                bVar5 = false;
                if (local_78 != 0) {
                  bVar5 = local_70[(long)in_RSI->data] == '\0';
                }
                if (!bVar5) break;
                local_78 = local_78 - 1;
                local_70 = local_70 + 1;
              }
              if (local_78 < 0x21) {
                memcpy(auStack_28 + -local_78,local_70 + (long)in_RSI->data,local_78);
              }
              bVar5 = local_78 >= 0x21;
              while( true ) {
                bVar6 = false;
                if (local_88 != 0) {
                  bVar6 = local_80[(long)in_RSI->data] == '\0';
                }
                if (!bVar6) break;
                local_88 = local_88 - 1;
                local_80 = local_80 + 1;
              }
              if (local_88 < 0x21) {
                memcpy((void *)((long)&local_8 - local_88),local_80 + (long)in_RSI->data,local_88);
              }
              bVar2 = local_88 >= 0x21;
              bVar6 = bVar2 || bVar5;
              if (!bVar2 && !bVar5) {
                iVar3 = secp256k1_ecdsa_signature_parse_compact(in_RDI,in_RSI,in_RDX);
                bVar6 = iVar3 == 0;
              }
              if (bVar6) {
                memset(local_48,0,0x40);
                secp256k1_ecdsa_signature_parse_compact(in_RDI,in_RSI,in_RDX);
              }
              local_4c = 1;
            }
          }
        }
      }
    }
  }
LAB_010179c6:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_4c;
}

Assistant:

int ecdsa_signature_parse_der_lax(secp256k1_ecdsa_signature* sig, const unsigned char *input, size_t inputlen) {
    size_t rpos, rlen, spos, slen;
    size_t pos = 0;
    size_t lenbyte;
    unsigned char tmpsig[64] = {0};
    int overflow = 0;

    /* Hack to initialize sig with a correctly-parsed but invalid signature. */
    secp256k1_ecdsa_signature_parse_compact(secp256k1_context_static, sig, tmpsig);

    /* Sequence tag byte */
    if (pos == inputlen || input[pos] != 0x30) {
        return 0;
    }
    pos++;

    /* Sequence length bytes */
    if (pos == inputlen) {
        return 0;
    }
    lenbyte = input[pos++];
    if (lenbyte & 0x80) {
        lenbyte -= 0x80;
        if (lenbyte > inputlen - pos) {
            return 0;
        }
        pos += lenbyte;
    }

    /* Integer tag byte for R */
    if (pos == inputlen || input[pos] != 0x02) {
        return 0;
    }
    pos++;

    /* Integer length for R */
    if (pos == inputlen) {
        return 0;
    }
    lenbyte = input[pos++];
    if (lenbyte & 0x80) {
        lenbyte -= 0x80;
        if (lenbyte > inputlen - pos) {
            return 0;
        }
        while (lenbyte > 0 && input[pos] == 0) {
            pos++;
            lenbyte--;
        }
        static_assert(sizeof(size_t) >= 4, "size_t too small");
        if (lenbyte >= 4) {
            return 0;
        }
        rlen = 0;
        while (lenbyte > 0) {
            rlen = (rlen << 8) + input[pos];
            pos++;
            lenbyte--;
        }
    } else {
        rlen = lenbyte;
    }
    if (rlen > inputlen - pos) {
        return 0;
    }
    rpos = pos;
    pos += rlen;

    /* Integer tag byte for S */
    if (pos == inputlen || input[pos] != 0x02) {
        return 0;
    }
    pos++;

    /* Integer length for S */
    if (pos == inputlen) {
        return 0;
    }
    lenbyte = input[pos++];
    if (lenbyte & 0x80) {
        lenbyte -= 0x80;
        if (lenbyte > inputlen - pos) {
            return 0;
        }
        while (lenbyte > 0 && input[pos] == 0) {
            pos++;
            lenbyte--;
        }
        static_assert(sizeof(size_t) >= 4, "size_t too small");
        if (lenbyte >= 4) {
            return 0;
        }
        slen = 0;
        while (lenbyte > 0) {
            slen = (slen << 8) + input[pos];
            pos++;
            lenbyte--;
        }
    } else {
        slen = lenbyte;
    }
    if (slen > inputlen - pos) {
        return 0;
    }
    spos = pos;

    /* Ignore leading zeroes in R */
    while (rlen > 0 && input[rpos] == 0) {
        rlen--;
        rpos++;
    }
    /* Copy R value */
    if (rlen > 32) {
        overflow = 1;
    } else {
        memcpy(tmpsig + 32 - rlen, input + rpos, rlen);
    }

    /* Ignore leading zeroes in S */
    while (slen > 0 && input[spos] == 0) {
        slen--;
        spos++;
    }
    /* Copy S value */
    if (slen > 32) {
        overflow = 1;
    } else {
        memcpy(tmpsig + 64 - slen, input + spos, slen);
    }

    if (!overflow) {
        overflow = !secp256k1_ecdsa_signature_parse_compact(secp256k1_context_static, sig, tmpsig);
    }
    if (overflow) {
        /* Overwrite the result again with a correctly-parsed but invalid
           signature if parsing failed. */
        memset(tmpsig, 0, 64);
        secp256k1_ecdsa_signature_parse_compact(secp256k1_context_static, sig, tmpsig);
    }
    return 1;
}